

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O3

void __thiscall pfederc::ArrayLitExpr::~ArrayLitExpr(ArrayLitExpr *this)

{
  std::__cxx11::
  _List_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ::_M_clear(&(this->exprs).
              super__List_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
            );
  operator_delete(this,0x50);
  return;
}

Assistant:

std::string ArrayLitExpr::toString() const noexcept {
  std::string result = "[";
  for (auto it = exprs.begin(); it != exprs.end(); ++it) {
    if (it != exprs.begin())
      result += ", ";

    result += (*it)->toString();
  }

  result += ']';

  return result;
}